

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O1

iterator * __thiscall
spvtools::EnumSet<spvtools::Extension>::cbegin
          (iterator *__return_storage_ptr__,EnumSet<spvtools::Extension> *this)

{
  bool bVar1;
  
  __return_storage_ptr__->set_ = this;
  __return_storage_ptr__->bucketIndex_ = 0;
  __return_storage_ptr__->bucketOffset_ = 0;
  if ((this->buckets_).
      super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->buckets_).
      super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = HasEnumAt(this,0,0);
    if (!bVar1) {
      Iterator::operator++(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

iterator cbegin() const noexcept {
    auto it = iterator(this, /* bucketIndex= */ 0, /* bucketOffset= */ 0);
    if (buckets_.size() == 0) {
      return it;
    }

    // The iterator has the logic to find the next valid bit. If the value 0
    // is not stored, use it to find the next valid bit.
    if (!HasEnumAt(it.bucketIndex_, it.bucketOffset_)) {
      ++it;
    }

    return it;
  }